

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cc
# Opt level: O0

example * VW::read_example(vw *all,char *example_line)

{
  example *peVar1;
  vw *in_RSI;
  long in_RDI;
  example *ret;
  example *in_stack_00000018;
  vw *in_stack_00000020;
  example *in_stack_000000b8;
  vw *in_stack_000000c0;
  
  peVar1 = get_unused_example(in_RSI);
  read_line(in_stack_00000020,in_stack_00000018,(char *)all);
  setup_example(in_stack_000000c0,in_stack_000000b8);
  *(long *)(*(long *)(in_RDI + 8) + 0x228) = *(long *)(*(long *)(in_RDI + 8) + 0x228) + 1;
  return peVar1;
}

Assistant:

example* read_example(vw& all, char* example_line)
{
  example* ret = &get_unused_example(&all);

  VW::read_line(all, ret, example_line);
  setup_example(all, ret);
  all.p->end_parsed_examples++;

  return ret;
}